

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void duckdb::Node::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  NType NVar1;
  InternalException *this;
  string local_60;
  string local_40;
  
  NVar1 = (NType)((node->super_IndexPointer).data >> 0x38);
  switch(NVar1 & 0x7f) {
  case NODE_4:
    Node4::InsertChild(art,node,byte,child);
    return;
  case NODE_16:
    Node16::InsertChild(art,node,byte,child);
    return;
  case NODE_48:
    Node48::InsertChild(art,node,byte,child);
    return;
  case NODE_256:
    Node256::InsertChild(art,node,byte,child);
    return;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Invalid node type for InsertChild: %s.","");
    EnumUtil::ToString<duckdb::NType>(&local_40,NVar1 & 0x7f);
    InternalException::InternalException<std::__cxx11::string>(this,&local_60,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case NODE_7_LEAF:
    Node7Leaf::InsertByte(art,node,byte);
    return;
  case NODE_15_LEAF:
    Node15Leaf::InsertByte(art,node,byte);
    return;
  case NODE_256_LEAF:
    Node256Leaf::InsertByte(art,node,byte);
    return;
  }
}

Assistant:

void Node::Free(ART &art, Node &node) {
	if (!node.HasMetadata()) {
		return node.Clear();
	}

	// Free the children.
	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::Free(art, node);
	case NType::LEAF:
		return Leaf::DeprecatedFree(art, node);
	case NType::NODE_4:
		Node4::Free(art, node);
		break;
	case NType::NODE_16:
		Node16::Free(art, node);
		break;
	case NType::NODE_48:
		Node48::Free(art, node);
		break;
	case NType::NODE_256:
		Node256::Free(art, node);
		break;
	case NType::LEAF_INLINED:
		return node.Clear();
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF:
		break;
	}

	GetAllocator(art, type).Free(node);
	node.Clear();
}